

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::SubroutineSymbol::serializeTo(SubroutineSymbol *this,ASTSerializer *serializer)

{
  ushort uVar1;
  pointer ppFVar2;
  size_t sVar3;
  Type *__n;
  Statement *__n_00;
  bitmask<slang::ast::MethodFlags> flags;
  long lVar4;
  string_view sVar5;
  string sStack_48;
  
  __n = DeclaredType::getType(&this->declaredReturnType);
  ASTSerializer::write(serializer,10,"returnType",(size_t)__n);
  sVar5 = ast::toString(this->defaultLifetime);
  ASTSerializer::write(serializer,0xf,"defaultLifetime",sVar5._M_len);
  sVar5 = ast::toString(this->subroutineKind);
  ASTSerializer::write(serializer,0xe,"subroutineKind",sVar5._M_len);
  __n_00 = getBody(this);
  ASTSerializer::write(serializer,4,"body",(size_t)__n_00);
  sVar5 = ast::toString(this->visibility);
  ASTSerializer::write(serializer,10,"visibility",sVar5._M_len);
  sVar5._M_str = "arguments";
  sVar5._M_len = 9;
  ASTSerializer::startArray(serializer,sVar5);
  ppFVar2 = (this->arguments)._M_ptr;
  sVar3 = (this->arguments)._M_extent._M_extent_value;
  for (lVar4 = 0; sVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
    ASTSerializer::serialize(serializer,*(Symbol **)((long)ppFVar2 + lVar4),false);
  }
  ASTSerializer::endArray(serializer);
  uVar1 = (this->flags).m_bits;
  if (uVar1 != 0) {
    flagsToStr_abi_cxx11_(&sStack_48,(ast *)(ulong)uVar1,flags);
    ASTSerializer::write(serializer,5,"flags",(size_t)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void SubroutineSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("returnType", getReturnType());
    serializer.write("defaultLifetime", toString(defaultLifetime));
    serializer.write("subroutineKind", toString(subroutineKind));
    serializer.write("body", getBody());
    serializer.write("visibility", toString(visibility));

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    if (flags)
        serializer.write("flags", flagsToStr(flags));
}